

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PPointer * NewPointer(PType *type)

{
  PClass *len;
  PPointer *local_20;
  PType *ptype;
  size_t bucket;
  PType *type_local;
  
  len = PPointer::RegistrationInfo.MyClass;
  bucket = (size_t)type;
  local_20 = (PPointer *)
             FTypeTable::FindType
                       (&TypeTable,PPointer::RegistrationInfo.MyClass,(intptr_t)type,0,
                        (size_t *)&ptype);
  if (local_20 == (PPointer *)0x0) {
    local_20 = (PPointer *)DObject::operator_new((DObject *)0x88,(size_t)len);
    PPointer::PPointer(local_20,(PType *)bucket);
    FTypeTable::AddType(&TypeTable,(PType *)local_20,PPointer::RegistrationInfo.MyClass,bucket,0,
                        (size_t)ptype);
  }
  return local_20;
}

Assistant:

PPointer *NewPointer(PType *type)
{
	size_t bucket;
	PType *ptype = TypeTable.FindType(RUNTIME_CLASS(PPointer), (intptr_t)type, 0, &bucket);
	if (ptype == NULL)
	{
		ptype = new PPointer(type);
		TypeTable.AddType(ptype, RUNTIME_CLASS(PPointer), (intptr_t)type, 0, bucket);
	}
	return static_cast<PPointer *>(ptype);
}